

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v1_decoder.cpp
# Opt level: O2

int __thiscall zmq::v1_decoder_t::one_byte_size_ready(v1_decoder_t *this,uchar *param_1)

{
  msg_t *this_00;
  byte bVar1;
  int iVar2;
  code *pcVar3;
  int *piVar4;
  char *pcVar5;
  EVP_PKEY_CTX *ctx;
  
  bVar1 = this->_tmpbuf[0];
  if (bVar1 == 0) {
    piVar4 = __errno_location();
    *piVar4 = 0x47;
  }
  else {
    if (bVar1 == 0xff) {
      (this->super_decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator>)._read_pos =
           this->_tmpbuf;
      (this->super_decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator>)._to_read = 8;
      pcVar3 = eight_byte_size_ready;
LAB_00185529:
      (this->super_decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator>)._next =
           (step_t)pcVar3;
      *(undefined8 *)
       &(this->super_decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator>).field_0x10 = 0;
      return 0;
    }
    if (this->_max_msg_size < (long)((ulong)bVar1 - 1) && -1 < this->_max_msg_size) {
      piVar4 = __errno_location();
      *piVar4 = 0x5a;
    }
    else {
      this_00 = &this->_in_progress;
      msg_t::close(this_00,(int)param_1);
      ctx = (EVP_PKEY_CTX *)((ulong)this->_tmpbuf[0] - 1);
      iVar2 = msg_t::init_size(this_00,(size_t)ctx);
      if (iVar2 == 0) {
        (this->super_decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator>)._read_pos =
             this->_tmpbuf;
        (this->super_decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator>)._to_read = 1;
        pcVar3 = flags_ready;
        goto LAB_00185529;
      }
      piVar4 = __errno_location();
      if (*piVar4 != 0xc) {
        pcVar5 = strerror(*piVar4);
        ctx = (EVP_PKEY_CTX *)0x18cdb5;
        fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/v1_decoder.cpp"
                ,0x53);
        fflush(_stderr);
        zmq_abort(pcVar5);
      }
      iVar2 = msg_t::init(this_00,ctx);
      if (iVar2 != 0) {
        pcVar5 = strerror(*piVar4);
        fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/v1_decoder.cpp"
                ,0x55);
        fflush(_stderr);
        zmq_abort(pcVar5);
      }
      *piVar4 = 0xc;
    }
  }
  return -1;
}

Assistant:

int zmq::v1_decoder_t::one_byte_size_ready (unsigned char const *)
{
    //  First byte of size is read. If it is UCHAR_MAX (0xff) read 8-byte size.
    //  Otherwise allocate the buffer for message data and read the
    //  message data into it.
    if (*_tmpbuf == UCHAR_MAX)
        next_step (_tmpbuf, 8, &v1_decoder_t::eight_byte_size_ready);
    else {
        //  There has to be at least one byte (the flags) in the message).
        if (!*_tmpbuf) {
            errno = EPROTO;
            return -1;
        }

        if (_max_msg_size >= 0
            && static_cast<int64_t> (*_tmpbuf - 1) > _max_msg_size) {
            errno = EMSGSIZE;
            return -1;
        }

        int rc = _in_progress.close ();
        assert (rc == 0);
        rc = _in_progress.init_size (*_tmpbuf - 1);
        if (rc != 0) {
            errno_assert (errno == ENOMEM);
            rc = _in_progress.init ();
            errno_assert (rc == 0);
            errno = ENOMEM;
            return -1;
        }

        next_step (_tmpbuf, 1, &v1_decoder_t::flags_ready);
    }
    return 0;
}